

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O3

QVariant * __thiscall
HtmlModelSerialiserPrivate::readHtmlVariant
          (QVariant *__return_storage_ptr__,HtmlModelSerialiserPrivate *this,
          QXmlStreamReader *reader,int valType)

{
  char cVar1;
  QString *val;
  long extraout_RDX;
  QStringView QVar2;
  QStringView QVar3;
  undefined1 auVar4 [16];
  QXmlStreamAttributes imgAttributes;
  QString local_78;
  QArrayDataPointer<QXmlStreamAttribute> local_60;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  
  if ((valType - 0x1001U < 9) && ((0x121U >> (valType - 0x1001U & 0x1f) & 1) != 0)) {
    cVar1 = QXmlStreamReader::readNextStartElement();
    if (cVar1 != '\0') {
      auVar4 = QXmlStreamReader::name();
      if ((auVar4._0_8_ == 3) &&
         (QVar2.m_data = auVar4._8_8_, QVar2.m_size = 3, QVar3.m_data = L"img", QVar3.m_size = 3,
         cVar1 = QtPrivate::equalStrings(QVar2,QVar3), cVar1 != '\0')) {
        QXmlStreamReader::attributes();
        local_78.d.d = (Data *)0x0;
        local_78.d.ptr = L"src";
        local_78.d.size = 3;
        QXmlStreamAttributes::value((QString *)&local_60);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
          }
        }
        if (extraout_RDX == 0) {
          (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
          *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
          *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
        }
        else {
          local_48 = (QArrayData *)0x0;
          local_40 = L"src";
          local_38 = 3;
          auVar4 = QXmlStreamAttributes::value((QString *)&local_60);
          QString::QString(&local_78,auVar4._8_8_,auVar4._0_8_);
          val = (QString *)QString::remove((longlong)&local_78,0);
          AbstractStringSerialiserPrivate::loadVariant
                    (__return_storage_ptr__,&this->super_AbstractStringSerialiserPrivate,valType,val
                    );
          if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_48 != (QArrayData *)0x0) {
            LOCK();
            (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_48,2,8);
            }
          }
        }
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_60);
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  else {
    QXmlStreamReader::readElementText(&local_60,reader,0);
    AbstractStringSerialiserPrivate::loadVariant
              (__return_storage_ptr__,&this->super_AbstractStringSerialiserPrivate,valType,
               (QString *)&local_60);
    if (&(local_60.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d)->super_QArrayData,2,8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant HtmlModelSerialiserPrivate::readHtmlVariant(QXmlStreamReader &reader, int valType) const
{
    if (isImageType(valType)) {
        if (!reader.readNextStartElement())
            return QVariant();
        if (reader.name() != QStringLiteral("img"))
            return QVariant();
        const QXmlStreamAttributes imgAttributes = reader.attributes();
        if (!imgAttributes.hasAttribute(QStringLiteral("src")))
            return QVariant();
        return loadVariant(valType, imgAttributes.value(QStringLiteral("src")).toString().remove(0, QStringLiteral("data:image/png;base64,").size()));
    }
    return loadVariant(valType, reader.readElementText());
}